

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionData *
anon_unknown.dwarf_6f1cc::CheckUniqueness(ExpressionContext *ctx,FunctionData *function)

{
  bool bVar1;
  uint nameHash;
  bool_type bVar2;
  FunctionLookupChain local_90;
  TypeBase **local_78;
  undefined8 local_70;
  undefined8 local_68;
  MatchData *local_60;
  FunctionLookupChain local_58;
  FunctionData *local_40;
  FunctionData *value;
  FunctionLookupChain chain;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  
  chain.scope = (ScopeData *)function;
  nameHash = InplaceStr::hash(&function->name->name);
  LookupFunctionChainByName((FunctionLookupChain *)&value,ctx,nameHash);
  while( true ) {
    while( true ) {
      bVar2 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                        ((FunctionLookupChain *)&value);
      if (bVar2 == 0) {
        return (FunctionData *)0x0;
      }
      local_40 = FunctionLookupChain::operator*((FunctionLookupChain *)&value);
      if ((local_40 != (FunctionData *)0x0) && (local_40 != (FunctionData *)chain.scope)) break;
      FunctionLookupChain::next(&local_58,(FunctionLookupChain *)&value);
      value = (FunctionData *)local_58.node.start;
      chain.node.start = local_58.node.node;
      chain.node.node = (Node *)local_58.scope;
    }
    local_68 = (local_40->generics).head;
    local_60 = (local_40->generics).tail;
    local_78 = ((chain.scope)->types).data;
    local_70._0_4_ = ((chain.scope)->types).count;
    local_70._4_4_ = ((chain.scope)->types).max;
    bVar1 = SameGenerics(local_40->generics,*(IntrusiveList<MatchData> *)&(chain.scope)->types);
    if ((bVar1) &&
       ((local_40->type == *(TypeFunction **)&(chain.scope)->scopeDepth &&
        (local_40->scope->ownerType == *(TypeBase **)&(chain.scope)->ownerFunction->coroutine))))
    break;
    FunctionLookupChain::next(&local_90,(FunctionLookupChain *)&value);
    value = (FunctionData *)local_90.node.start;
    chain.node.start = local_90.node.node;
    chain.node.node = (Node *)local_90.scope;
  }
  return local_40;
}

Assistant:

FunctionData* CheckUniqueness(ExpressionContext &ctx, FunctionData* function)
	{
		FunctionLookupChain chain = LookupFunctionChainByName(ctx, function->name->name.hash());

		while(chain)
		{
			FunctionData *value = *chain;

			// Skip current function
			if(!value || value == function)
			{
				chain = chain.next();
				continue;
			}

			if(SameGenerics(value->generics, function->generics) && value->type == function->type && value->scope->ownerType == function->scope->ownerType)
				return value;

			chain = chain.next();
		}

		return NULL;
	}